

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_448ecb::BinaryExpr::printLeft(BinaryExpr *this,OutputStream *S)

{
  char *pcVar1;
  char *pcVar2;
  Node *pNVar3;
  int iVar4;
  size_t sVar5;
  
  pcVar1 = (this->InfixOperator).First;
  pcVar2 = (this->InfixOperator).Last;
  if (((long)pcVar2 - (long)pcVar1 == 1) &&
     ((pcVar2 == pcVar1 || (iVar4 = bcmp(pcVar1,">",1), iVar4 == 0)))) {
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = '(';
    S->CurrentPosition = S->CurrentPosition + 1;
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = '(';
  S->CurrentPosition = S->CurrentPosition + 1;
  pNVar3 = this->LHS;
  (*pNVar3->_vptr_Node[4])(pNVar3,S);
  if (pNVar3->RHSComponentCache != No) {
    (*pNVar3->_vptr_Node[5])(pNVar3,S);
  }
  OutputStream::grow(S,2);
  pcVar1 = S->Buffer;
  sVar5 = S->CurrentPosition;
  (pcVar1 + sVar5)[0] = ')';
  (pcVar1 + sVar5)[1] = ' ';
  S->CurrentPosition = S->CurrentPosition + 2;
  pcVar1 = (this->InfixOperator).First;
  sVar5 = (long)(this->InfixOperator).Last - (long)pcVar1;
  if (sVar5 != 0) {
    OutputStream::grow(S,sVar5);
    memmove(S->Buffer + S->CurrentPosition,pcVar1,sVar5);
    S->CurrentPosition = S->CurrentPosition + sVar5;
  }
  OutputStream::grow(S,2);
  pcVar1 = S->Buffer;
  sVar5 = S->CurrentPosition;
  (pcVar1 + sVar5)[0] = ' ';
  (pcVar1 + sVar5)[1] = '(';
  S->CurrentPosition = S->CurrentPosition + 2;
  pNVar3 = this->RHS;
  (*pNVar3->_vptr_Node[4])(pNVar3,S);
  if (pNVar3->RHSComponentCache != No) {
    (*pNVar3->_vptr_Node[5])(pNVar3,S);
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ')';
  S->CurrentPosition = S->CurrentPosition + 1;
  pcVar1 = (this->InfixOperator).First;
  pcVar2 = (this->InfixOperator).Last;
  if ((long)pcVar2 - (long)pcVar1 == 1) {
    if ((pcVar2 != pcVar1) && (iVar4 = bcmp(pcVar1,">",1), iVar4 != 0)) {
      return;
    }
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = ')';
    S->CurrentPosition = S->CurrentPosition + 1;
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    // might be a template argument expression, then we need to disambiguate
    // with parens.
    if (InfixOperator == ">")
      S += "(";

    S += "(";
    LHS->print(S);
    S += ") ";
    S += InfixOperator;
    S += " (";
    RHS->print(S);
    S += ")";

    if (InfixOperator == ">")
      S += ")";
  }